

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O1

void UnionRectWithRegion(QRect *rect,QRegionPrivate *source,QRegionPrivate *dest)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QRect *pQVar7;
  long in_FS_OFFSET;
  QRegionPrivate p;
  QRegionPrivate local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (rect->x1).m_i;
  iVar2 = (rect->y1).m_i;
  iVar3 = (rect->x2).m_i;
  iVar5 = iVar3 - iVar1;
  iVar4 = (rect->y2).m_i;
  iVar6 = iVar4 - iVar2;
  if (iVar2 <= iVar4 && iVar1 <= iVar3) {
    iVar3 = dest->numRects;
    if ((long)iVar3 == 0) {
      local_58.innerArea = (iVar6 + 1) * (iVar5 + 1);
      local_58.numRects = 1;
      local_58.rects.d.d = (Data *)0x0;
      local_58.rects.d.ptr = (QRect *)0x0;
      local_58.rects.d.size = 0;
      local_58.extents.x1.m_i = (rect->x1).m_i;
      local_58.extents.y1.m_i = (rect->y1).m_i;
      local_58.extents.x2.m_i = (rect->x2).m_i;
      local_58.extents.y2.m_i = (rect->y2).m_i;
      local_58.innerRect.x1.m_i = (rect->x1).m_i;
      local_58.innerRect.y1.m_i = (rect->y1).m_i;
      local_58.innerRect.x2.m_i = (rect->x2).m_i;
      local_58.innerRect.y2.m_i = (rect->y2).m_i;
      dest->numRects = 1;
      dest->innerArea = local_58.innerArea;
      QArrayDataPointer<QRect>::operator=(&(dest->rects).d,&local_58.rects.d);
      (dest->innerRect).x1 = (Representation)local_58.innerRect.x1.m_i;
      (dest->innerRect).y1 = (Representation)local_58.innerRect.y1.m_i;
      (dest->innerRect).x2 = (Representation)local_58.innerRect.x2.m_i;
      (dest->innerRect).y2 = (Representation)local_58.innerRect.y2.m_i;
      (dest->extents).x1 = (Representation)local_58.extents.x1.m_i;
      (dest->extents).y1 = (Representation)local_58.extents.y1.m_i;
      (dest->extents).x2 = (Representation)local_58.extents.x2.m_i;
      (dest->extents).y2 = (Representation)local_58.extents.y2.m_i;
    }
    else {
      pQVar7 = (dest->rects).d.ptr + (long)iVar3 + -1;
      if (iVar3 == 1) {
        pQVar7 = &dest->extents;
      }
      iVar3 = (pQVar7->y2).m_i;
      if ((iVar3 < iVar2) ||
         (((iVar4 = (pQVar7->y1).m_i, iVar2 == iVar4 && (iVar6 == iVar3 - iVar4)) &&
          ((pQVar7->x2).m_i < iVar1)))) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QRegionPrivate::append(dest,rect);
          return;
        }
        goto LAB_00433292;
      }
      local_58.innerArea = (iVar6 + 1) * (iVar5 + 1);
      local_58.numRects = 1;
      local_58.rects.d.d = (Data *)0x0;
      local_58.rects.d.ptr = (QRect *)0x0;
      local_58.rects.d.size = 0;
      local_58.extents.x1.m_i = (rect->x1).m_i;
      local_58.extents.y1.m_i = (rect->y1).m_i;
      local_58.extents.x2.m_i = (rect->x2).m_i;
      local_58.extents.y2.m_i = (rect->y2).m_i;
      local_58.innerRect.x1.m_i = (rect->x1).m_i;
      local_58.innerRect.y1.m_i = (rect->y1).m_i;
      local_58.innerRect.x2.m_i = (rect->x2).m_i;
      local_58.innerRect.y2.m_i = (rect->y2).m_i;
      UnionRegion(&local_58,source,dest);
    }
    if (&(local_58.rects.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_58.rects.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_58.rects.d.d)->super_QArrayData,0x10,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00433292:
  __stack_chk_fail();
}

Assistant:

static void UnionRectWithRegion(const QRect *rect, const QRegionPrivate *source,
                                QRegionPrivate &dest)
{
    if (rect->isEmpty())
        return;

    Q_ASSERT(EqualRegion(source, &dest));

    if (dest.numRects == 0) {
        dest = QRegionPrivate(*rect);
    } else if (dest.canAppend(rect)) {
        dest.append(rect);
    } else {
        QRegionPrivate p(*rect);
        UnionRegion(&p, source, dest);
    }
}